

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bit_vector.h
# Opt level: O3

void __thiscall
bsim::dynamic_bit_vector::dynamic_bit_vector(dynamic_bit_vector *this,int N_,string *str_raw)

{
  int iVar1;
  byte *pbVar2;
  char cVar3;
  byte bVar4;
  pointer puVar5;
  undefined8 uVar6;
  size_type sVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  string str;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar11 = 0;
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->N = N_;
  local_48 = 0;
  local_40[0] = 0;
  sVar7 = str_raw->_M_string_length;
  local_50 = local_40;
  if (0 < (int)sVar7) {
    lVar9 = 0;
    iVar11 = 0;
    do {
      cVar3 = (str_raw->_M_dataplus)._M_p[lVar9];
      if ((int)cVar3 - 0x30U < 10) {
        std::__cxx11::string::push_back((char)&local_50);
        iVar11 = iVar11 + 1;
        sVar7 = str_raw->_M_string_length;
      }
      else if (cVar3 != '_') {
        __assert_fail("str_raw[i] == \'_\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/dynamic_bit_vector.h"
                      ,0x99,
                      "bsim::dynamic_bit_vector::dynamic_bit_vector(const int, const std::string &)"
                     );
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (int)sVar7);
    N_ = this->N;
  }
  uVar6 = local_48;
  if (N_ < iVar11) {
    __assert_fail("num_digits <= N",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/dynamic_bit_vector.h"
                  ,0x9c,
                  "bsim::dynamic_bit_vector::dynamic_bit_vector(const int, const std::string &)");
  }
  uVar12 = N_ + 7;
  if (-1 < N_) {
    uVar12 = N_;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->bits,(long)(int)((((int)uVar12 >> 3) - (uint)((N_ & 7U) == 0)) + 1));
  uVar12 = (uint)uVar6;
  if (0 < (int)uVar12) {
    uVar8 = (ulong)(uVar12 & 0x7fffffff) + 1;
    iVar11 = 0;
    do {
      uVar10 = (uVar12 & 0x80000000) + iVar11 >> 3;
      puVar5 = (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar4 = puVar5[uVar10];
      puVar5[uVar10] =
           '\x01' << ((byte)iVar11 & 7) & (-(local_50[uVar8 - 2] != '0') ^ bVar4) ^ bVar4;
      uVar8 = uVar8 - 1;
      iVar11 = iVar11 + 1;
    } while (1 < uVar8);
  }
  iVar11 = this->N;
  while ((int)uVar12 < iVar11) {
    iVar1 = iVar11 + -1;
    iVar11 = iVar11 + 6;
    if (-1 < iVar1) {
      iVar11 = iVar1;
    }
    pbVar2 = (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + (iVar11 >> 3);
    *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar1 & 7));
    iVar11 = iVar1;
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

dynamic_bit_vector(const int N_, const std::string& str_raw) : N(N_) {
      int num_digits = 0;
      std::string str;
      for (int i = 0; i < ((int) str_raw.size()); i++) {
	if (isdigit(str_raw[i])) {
	  num_digits++;
	  str += str_raw[i];
	} else {
	  assert(str_raw[i] == '_');
	}
      }
      assert(num_digits <= N);

      int len = str.size();      
      bits.resize(NUM_BYTES(N));
      for (int i = len - 1; i >= 0; i--) {
        unsigned char val = (str[i] == '0') ? 0 : 1;
        int ind = len - i - 1;
        set(ind, val);
      }
      for (int i = N-1; i>=len; i--) {
        set(i,0);
      }
    }